

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZipReader.cpp
# Opt level: O2

IFileArchive * __thiscall
irr::io::CArchiveLoaderZIP::createArchive
          (CArchiveLoaderZIP *this,path *filename,bool ignoreCase,bool ignorePaths)

{
  int iVar1;
  long *plVar2;
  undefined4 extraout_var;
  IFileArchive *pIVar3;
  
  plVar2 = (long *)(**(code **)**(undefined8 **)&(this->super_IArchiveLoader).field_0x8)();
  if (plVar2 == (long *)0x0) {
    pIVar3 = (IFileArchive *)0x0;
  }
  else {
    iVar1 = (*(this->super_IArchiveLoader)._vptr_IArchiveLoader[4])
                      (this,plVar2,ignoreCase,ignorePaths);
    pIVar3 = (IFileArchive *)CONCAT44(extraout_var,iVar1);
    IReferenceCounted::drop((IReferenceCounted *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  }
  return pIVar3;
}

Assistant:

IFileArchive *CArchiveLoaderZIP::createArchive(const io::path &filename, bool ignoreCase, bool ignorePaths) const
{
	IFileArchive *archive = 0;
	io::IReadFile *file = FileSystem->createAndOpenFile(filename);

	if (file) {
		archive = createArchive(file, ignoreCase, ignorePaths);
		file->drop();
	}

	return archive;
}